

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          long params,unsigned_long params_1)

{
  string *value;
  unsigned_long params_00;
  undefined1 auStack_88 [56];
  string local_50 [32];
  
  params_00 = params;
  ::std::__cxx11::string::string((string *)auStack_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(auStack_88 + 0x20),(ExceptionFormatValue *)auStack_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(auStack_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)auStack_88);
  ConstructMessageRecursive<long,unsigned_long>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,params,params_00);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}